

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_can_have_alpha(LodePNGColorMode *info)

{
  uint uVar1;
  bool local_11;
  LodePNGColorMode *info_local;
  
  local_11 = true;
  if (info->key_defined == 0) {
    uVar1 = lodepng_is_alpha_type(info);
    local_11 = true;
    if (uVar1 == 0) {
      uVar1 = lodepng_has_palette_alpha(info);
      local_11 = uVar1 != 0;
    }
  }
  return (uint)local_11;
}

Assistant:

unsigned lodepng_can_have_alpha(const LodePNGColorMode* info)
{
  return info->key_defined
      || lodepng_is_alpha_type(info)
      || lodepng_has_palette_alpha(info);
}